

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawBuffersTest::iterate(DrawBuffersTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  GLfloat GVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  undefined4 *puVar9;
  GLint i;
  long lVar10;
  char *description;
  GLint i_1;
  GLint i_2;
  GLint i_4;
  long lVar11;
  float fVar12;
  float fVar13;
  GLint max_color_attachments;
  GLuint framebuffer;
  DrawBuffersTest *local_200;
  GLfloat rgba [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderbuffers;
  GLenum none_bufs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> color_attachments;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_200 = this;
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    framebuffer = 0;
    max_color_attachments = 8;
    (**(code **)(lVar7 + 0x868))(0x8cdf,&max_color_attachments);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x60c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&renderbuffers,(long)max_color_attachments,(allocator_type *)local_1b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&color_attachments,(long)max_color_attachments,(allocator_type *)local_1b0);
    for (lVar10 = 0; lVar10 < max_color_attachments; lVar10 = lVar10 + 1) {
      renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = 0;
      color_attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = (int)lVar10 + 0x8ce0;
    }
    (**(code **)(lVar7 + 0x6d0))(1,&framebuffer);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61b);
    (**(code **)(lVar7 + 0x78))(0x8d40,framebuffer);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x61e);
    (**(code **)(lVar7 + 0x6e8))
              (max_color_attachments,
               renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x621);
    for (lVar10 = 0; lVar10 < max_color_attachments; lVar10 = lVar10 + 1) {
      (**(code **)(lVar7 + 0xa0))
                (0x8d41,renderbuffers.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar10]);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x627);
      (**(code **)(lVar7 + 0x1238))(0x8d41,0x8814,1,1);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x62a);
      (**(code **)(lVar7 + 0x688))
                (0x8d40,(int)lVar10 + 0x8ce0,0x8d41,
                 renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar10]);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glFramebufferRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x62d);
    }
    iVar4 = (**(code **)(lVar7 + 0x170))(0x8d40);
    if (iVar4 != 0x8cd5) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Framebuffer is unexpectedly incomplete.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 0;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
    (**(code **)(lVar7 + 0xef8))
              (framebuffer,max_color_attachments,
               color_attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start);
    GVar6 = (GLfloat)(**(code **)(lVar7 + 0x800))();
    bVar2 = GVar6 == 0.0;
    if (!bVar2) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"NamedFramebufferDrawBuffers unexpectedly generated ");
      rgba._0_8_ = glu::getErrorName;
      rgba[2] = GVar6;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)rgba,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," error. Test fails.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    for (iVar4 = 0; iVar4 < max_color_attachments; iVar4 = iVar4 + 1) {
      (**(code **)(lVar7 + 0x1c0))(0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glClearColor has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x648);
      (**(code **)(lVar7 + 0x188))(0x4000);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glClear has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x64b);
    }
    poVar1 = (ostringstream *)(local_1b0 + 8);
    for (iVar4 = 0; iVar4 < max_color_attachments; iVar4 = iVar4 + 1) {
      (**(code **)(lVar7 + 0x1218))(iVar4 + 0x8ce0);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glReadBuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x652);
      rgba[0] = -1.0;
      rgba[1] = -1.0;
      rgba[2] = -1.0;
      rgba[3] = -1.0;
      (**(code **)(lVar7 + 0x1220))(0,0,1,1,0x1908,0x1406,rgba);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glReadPixels has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x657);
      lVar10 = 0;
      do {
        if (lVar10 == 0x10) goto LAB_00afb473;
        fVar12 = *(float *)((long)&s_rgba + lVar10) - *(float *)((long)rgba + lVar10);
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        lVar10 = lVar10 + 4;
      } while (fVar13 <= 0.0001);
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
                     );
      std::ostream::operator<<(poVar1,rgba[0]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,rgba[1]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,rgba[2]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,rgba[3]);
      std::operator<<((ostream *)poVar1,"] but [");
      pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(float *)&s_rgba);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(float *)&DAT_0170e2c4);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(float *)&DAT_0170e2c8);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(float *)&DAT_0170e2cc);
      std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] had been expected.");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar2 = false;
LAB_00afb473:
    }
    (**(code **)(lVar7 + 0xef8))(framebuffer);
    GVar6 = (GLfloat)(**(code **)(lVar7 + 0x800))();
    if (GVar6 != 0.0) {
      local_1b0._0_8_ = ((local_200->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"NamedFramebufferDrawBuffers unexpectedly generated ");
      rgba._0_8_ = glu::getErrorName;
      rgba[2] = GVar6;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)rgba,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," error with GL_NONE mode. Test fails.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar2 = false;
    }
    if (framebuffer != 0) {
      (**(code **)(lVar7 + 0x440))(1);
      framebuffer = 0;
    }
    lVar11 = 0;
    for (lVar10 = 0; lVar10 < max_color_attachments; lVar10 = lVar10 + 1) {
      if (*(int *)((long)renderbuffers.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar11) != 0) {
        (**(code **)(lVar7 + 0x460))(1);
      }
      lVar11 = lVar11 + 4;
    }
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0);
    do {
      iVar4 = (**(code **)(lVar7 + 0x800))();
    } while (iVar4 != 0);
    description = "Pass";
    if (!bVar2) {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((local_200->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
               description);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&color_attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&renderbuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    tcu::TestContext::setTestResult
              ((local_200->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	glw::GLuint framebuffer = 0;

	/* Get number of color attachments. */
	glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	std::vector<glw::GLuint> renderbuffers(max_color_attachments);
	std::vector<glw::GLuint> color_attachments(max_color_attachments);

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		renderbuffers[i]	 = 0;
		color_attachments[i] = GL_COLOR_ATTACHMENT0 + i;
	}

	try
	{
		/* Prepare framebuffer... */
		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genRenderbuffers(max_color_attachments, &(renderbuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		/* .. with renderbuffer color attachments. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}

		/* Set up all attachments as draw buffer. */
		gl.namedFramebufferDrawBuffers(framebuffer, max_color_attachments, &(color_attachments[0]));

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}

		/* Clear each of the framebuffer's attachments with unique color using NamedFramebufferDrawBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.clearColor(s_rgba[0], s_rgba[1], s_rgba[2], s_rgba[3]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor has failed");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear has failed");
		}

		/* Fetch framebuffer's content and compare it with reference using NamedFramebufferReadBuffer for attachment selection. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");

			glw::GLfloat rgba[4] = { -1.f, -1.f, -1.f, -1.f };

			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, rgba);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

			for (glw::GLuint j = 0; j < 4 /* number of components */; ++j)
			{
				if (de::abs(s_rgba[j] - rgba[j]) > 0.0001 /* Precision */)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "Named Framebuffer Draw Buffers test have failed because resulting color value was ["
						<< rgba[0] << ", " << rgba[1] << ", " << rgba[2] << ", " << rgba[3] << "] but [" << s_rgba[0]
						<< ", " << s_rgba[1] << ", " << s_rgba[2] << ", " << s_rgba[3] << "] had been expected."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					break;
				}
			}
		}

		/* Check that NamedFramebufferDrawBuffers accepts GL_NONE as mode. */
		glw::GLenum none_bufs = GL_NONE;
		gl.namedFramebufferDrawBuffers(framebuffer, 1, &none_bufs);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "NamedFramebufferDrawBuffers unexpectedly generated "
				<< glu::getErrorStr(error) << " error with GL_NONE mode. Test fails." << tcu::TestLog::EndMessage;
			is_ok = false;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);

		framebuffer = 0;
	}

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		if (renderbuffers[i])
		{
			gl.deleteRenderbuffers(1, &(renderbuffers[i]));
		}
	}

	gl.clearColor(0.f, 0.f, 0.f, 0.f);

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}